

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.cpp
# Opt level: O0

void __thiscall
zmq::xpub_t::xattach_pipe(xpub_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  ssize_t sVar6;
  undefined8 in_RCX;
  char *__n;
  undefined1 in_DL;
  pipe_t *ctx;
  EVP_PKEY_CTX *src;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  pipe_t *in_RSI;
  long in_RDI;
  bool ok;
  char *errstr;
  int rc;
  msg_t copy;
  pipe_t *in_stack_00000088;
  xpub_t *in_stack_00000090;
  undefined7 in_stack_ffffffffffffff90;
  pipe_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  msg_t local_58;
  byte local_12;
  byte local_11;
  pipe_t *local_10;
  
  __n = (char *)(CONCAT71((int7)((ulong)in_RCX >> 8),in_DL) & 0xffffffffffffff01);
  local_11 = (byte)__n;
  local_12 = (byte)in_RCX & 1;
  local_10 = in_RSI;
  if (in_RSI == (pipe_t *)0x0) {
    __n = 
    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xpub.cpp"
    ;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xpub.cpp"
            ,0x4b);
    fflush(_stderr);
    zmq_abort((char *)0x210f50);
  }
  ctx = local_10;
  dist_t::attach((dist_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
  if ((local_11 & 1) != 0) {
    ctx = (pipe_t *)0x0;
    __n = (char *)local_10;
    generic_mtrie_t<zmq::pipe_t>::add
              ((generic_mtrie_t<zmq::pipe_t> *)copy._u._48_8_,(prefix_t)copy._u._40_8_,
               copy._u._32_8_,(value_t *)copy._u._24_8_);
  }
  sVar3 = msg_t::size((msg_t *)in_stack_ffffffffffffff98);
  if (sVar3 != 0) {
    msg_t::init(&local_58,(EVP_PKEY_CTX *)ctx);
    iVar2 = msg_t::copy(&local_58,(EVP_PKEY_CTX *)(in_RDI + 0x7b8),src);
    __buf = extraout_RDX;
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      __n = 
      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xpub.cpp"
      ;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xpub.cpp"
              ,0x58);
      fflush(_stderr);
      zmq_abort((char *)0x21102b);
      __buf = extraout_RDX_00;
    }
    sVar6 = pipe_t::write(local_10,(int)&local_58,__buf,(size_t)__n);
    bVar1 = (byte)sVar6 & 1;
    if (((bVar1 ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ok",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xpub.cpp"
              ,0x5a);
      fflush(_stderr);
      zmq_abort((char *)0x211095);
    }
    pipe_t::flush((pipe_t *)CONCAT17(bVar1,in_stack_ffffffffffffff90));
  }
  xread_activated(in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

void zmq::xpub_t::xattach_pipe (pipe_t *pipe_,
                                bool subscribe_to_all_,
                                bool locally_initiated_)
{
    LIBZMQ_UNUSED (locally_initiated_);

    zmq_assert (pipe_);
    _dist.attach (pipe_);

    //  If subscribe_to_all_ is specified, the caller would like to subscribe
    //  to all data on this pipe, implicitly.
    if (subscribe_to_all_)
        _subscriptions.add (NULL, 0, pipe_);

    // if welcome message exists, send a copy of it
    if (_welcome_msg.size () > 0) {
        msg_t copy;
        copy.init ();
        const int rc = copy.copy (_welcome_msg);
        errno_assert (rc == 0);
        const bool ok = pipe_->write (&copy);
        zmq_assert (ok);
        pipe_->flush ();
    }

    //  The pipe is active when attached. Let's read the subscriptions from
    //  it, if any.
    xread_activated (pipe_);
}